

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ringbuffer.cpp
# Opt level: O2

ssize_t __thiscall RingbufferBase::read(RingbufferBase *this,int __fd,void *__buf,size_t __nbytes)

{
  void *sizeInBytes;
  undefined4 in_register_00000034;
  void *src;
  size_t bytesToRead;
  void *local_30;
  void *local_28;
  
  local_28 = __buf;
  ma_rb_acquire_read(&this->mRingbuffer,(size_t *)&local_28,&local_30);
  sizeInBytes = local_28;
  memcpy((void *)CONCAT44(in_register_00000034,__fd),local_30,(size_t)local_28);
  ma_rb_commit_read(&this->mRingbuffer,(size_t)sizeInBytes);
  return (ssize_t)local_28;
}

Assistant:

size_t RingbufferBase::read(void *data, size_t sizeInBytes) {
    size_t bytesToRead = sizeInBytes;
    void *src;
    
    auto result = ma_rb_acquire_read(&mRingbuffer, &bytesToRead, &src);
    Q_ASSERT(result == MA_SUCCESS);

    memcpy(data, src, bytesToRead);
    
    result = ma_rb_commit_read(&mRingbuffer, bytesToRead);
    Q_ASSERT(result == MA_SUCCESS || result == MA_AT_END);
    
    Q_UNUSED(result)
    return bytesToRead;
}